

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

void cram_byte_array_len_decode_free(cram_codec *c)

{
  cram_codec *c_local;
  
  if (c != (cram_codec *)0x0) {
    if ((c->field_6).byte_array_len.len_codec != (cram_codec *)0x0) {
      (*((c->field_6).byte_array_len.len_codec)->free)((c->field_6).byte_array_len.len_codec);
    }
    if ((c->field_6).huffman.codes != (cram_huffman_code *)0x0) {
      (*((c->field_6).byte_array_len.value_codec)->free)((cram_codec *)(c->field_6).huffman.codes);
    }
    free(c);
  }
  return;
}

Assistant:

void cram_byte_array_len_decode_free(cram_codec *c) {
    if (!c) return;

    if (c->byte_array_len.len_codec)
	c->byte_array_len.len_codec->free(c->byte_array_len.len_codec);

    if (c->byte_array_len.value_codec)
	c->byte_array_len.value_codec->free(c->byte_array_len.value_codec);

    free(c);
}